

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>::
         Construct(DB *db,LIST *params)

{
  IfcSimpleProperty *this;
  
  this = (IfcSimpleProperty *)operator_new(200);
  this[1].super_IfcProperty.Description.ptr._M_dataplus._M_p = (pointer)&PTR__Object_00816a50;
  this[1].super_IfcProperty.Description.ptr._M_string_length = 0;
  this[1].super_IfcProperty.Description.ptr.field_2._M_allocated_capacity =
       (size_type)"IfcPropertyReferenceValue";
  Assimp::IFC::Schema_2x3::IfcSimpleProperty::IfcSimpleProperty
            (this,&PTR_construction_vtable_24__00834448);
  *(undefined8 *)&this->field_0x70 = 0;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcPropertyReferenceValue_008343b8;
  this[1].super_IfcProperty.Description.ptr._M_dataplus._M_p =
       (pointer)&PTR__IfcPropertyReferenceValue_00834430;
  *(undefined ***)&(this->super_IfcProperty).field_0x58 = &PTR__IfcPropertyReferenceValue_008343e0;
  *(undefined ***)&(this->super_IfcProperty).field_0x68 = &PTR__IfcPropertyReferenceValue_00834408;
  *(bitset<2UL> **)&this->field_0x78 =
       &this[1].super_IfcProperty.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
        aux_is_derived;
  this[1].super_IfcProperty.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x0;
  *(undefined1 *)
   &this[1].super_IfcProperty.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
    aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  this[1].super_IfcProperty.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x18
       = 0;
  *(undefined8 *)
   &this[1].super_IfcProperty.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
    field_0x20 = 0;
  *(undefined8 *)&this[1].super_IfcProperty.field_0x28 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcSimpleProperty>(db,params,this);
  return (Object *)
         ((long)&(this->super_IfcProperty).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper +
         (long)(this->super_IfcProperty).
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper[-3])
  ;
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }